

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O2

void __thiscall
BiquadFilter::SetupHighShelf(BiquadFilter *this,float cutoff,float samplerate,float gain,float Q)

{
  undefined4 uVar1;
  float fVar2;
  float __x;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_18;
  
  fVar2 = (cutoff * 6.2831855) / samplerate;
  __x = powf(10.0,gain * 0.025);
  fVar3 = sinf(fVar2);
  fVar3 = fVar3 / (Q + Q);
  fVar7 = __x + 1.0;
  fVar8 = __x + -1.0;
  fVar4 = cosf(fVar2);
  local_18 = SQRT(__x);
  fVar5 = local_18;
  if (__x < 0.0) {
    fVar5 = sqrtf(__x);
  }
  this->b0 = ((fVar5 + fVar5) * fVar3 + fVar4 * fVar8 + fVar7) * __x;
  fVar5 = cosf(fVar2);
  this->b1 = (fVar5 * fVar7 + fVar8) * __x * -2.0;
  fVar4 = cosf(fVar2);
  fVar5 = local_18;
  if (__x < 0.0) {
    fVar5 = sqrtf(__x);
  }
  this->b2 = (fVar5 * -2.0 * fVar3 + fVar4 * fVar8 + fVar7) * __x;
  fVar4 = cosf(fVar2);
  fVar5 = local_18;
  if (__x < 0.0) {
    fVar5 = sqrtf(__x);
  }
  fVar6 = cosf(fVar2);
  fVar6 = fVar8 - fVar6 * fVar7;
  this->a1 = fVar6 + fVar6;
  fVar2 = cosf(fVar2);
  if (__x < 0.0) {
    local_18 = sqrtf(__x);
  }
  fVar5 = 1.0 / ((fVar5 + fVar5) * fVar3 + (fVar7 - fVar4 * fVar8));
  uVar1 = this->a1;
  this->a1 = (float)uVar1 * fVar5;
  this->a2 = (local_18 * -2.0 * fVar3 + -fVar8 * fVar2 + fVar7) * fVar5;
  this->b0 = this->b0 * fVar5;
  this->b1 = this->b1 * fVar5;
  this->b2 = fVar5 * this->b2;
  return;
}

Assistant:

void BiquadFilter::SetupHighShelf(float cutoff, float samplerate, float gain, float Q)
{
    float w0 = 2.0f * kPI * cutoff / samplerate, A = powf(10.0f, gain * 0.025f), alpha = sinf(w0) / (2.0f * Q), a0;
    b0 =          A * ((A + 1.0f) + (A - 1.0f) * cosf(w0) + 2.0f * sqrtf(A) * alpha);
    b1 =  -2.0f * A * ((A - 1.0f) + (A + 1.0f) * cosf(w0));
    b2 =          A * ((A + 1.0f) + (A - 1.0f) * cosf(w0) - 2.0f * sqrtf(A) * alpha);
    a0 =               (A + 1.0f) - (A - 1.0f) * cosf(w0) + 2.0f * sqrtf(A) * alpha;
    a1 =   2.0f     * ((A - 1.0f) - (A + 1.0f) * cosf(w0));
    a2 =               (A + 1.0f) - (A - 1.0f) * cosf(w0) - 2.0f * sqrtf(A) * alpha;
    float inv_a0 = 1.0f / a0; a1 *= inv_a0; a2 *= inv_a0; b0 *= inv_a0; b1 *= inv_a0; b2 *= inv_a0;
}